

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

bool __thiscall google::protobuf::StringPiece::ConsumeFromEnd(StringPiece *this,StringPiece x)

{
  StringPiece x_00;
  bool bVar1;
  char *in_RDX;
  StringPiece *in_RSI;
  long in_RDI;
  
  x_00.length_ = in_RDI;
  x_00.ptr_ = in_RDX;
  bVar1 = ends_with(in_RSI,x_00);
  if (bVar1) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) - (long)in_RDX;
  }
  return bVar1;
}

Assistant:

bool StringPiece::ConsumeFromEnd(StringPiece x) {
  if (ends_with(x)) {
    length_ -= x.length_;
    return true;
  }
  return false;
}